

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

void __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::
step_fill<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)6>_>
          (xpath_ast_node *this,xpath_node_set_raw *ns,long *xn,xpath_allocator *alloc,byte once)

{
  xml_node_struct *pxVar1;
  bool bVar2;
  xml_node_struct *pxVar3;
  
  pxVar3 = (xml_node_struct *)*xn;
  if (pxVar3 == (xml_node_struct *)0x0 || xn[1] != 0) {
    if (pxVar3 != (xml_node_struct *)0x0 && xn[1] != 0) {
      do {
        pxVar1 = pxVar3->first_child;
        if (pxVar3->first_child == (xml_node_struct *)0x0) {
          while (pxVar1 = pxVar3->next_sibling, pxVar3->next_sibling == (xml_node_struct *)0x0) {
            pxVar3 = pxVar3->parent;
            if (pxVar3 == (xml_node_struct *)0x0) {
              return;
            }
          }
        }
        pxVar3 = pxVar1;
        bVar2 = step_push(this,ns,pxVar3,alloc);
      } while ((bVar2 & once) != 1);
    }
  }
  else {
    do {
      pxVar1 = pxVar3->next_sibling;
      if (pxVar3->next_sibling != (xml_node_struct *)0x0) {
        do {
          do {
            pxVar3 = pxVar1;
            bVar2 = step_push(this,ns,pxVar3,alloc);
            if ((bVar2 & once) != 0) {
              return;
            }
            pxVar1 = pxVar3->first_child;
          } while (pxVar3->first_child != (xml_node_struct *)0x0);
          while (pxVar1 = pxVar3->next_sibling, pxVar3->next_sibling == (xml_node_struct *)0x0) {
            pxVar3 = pxVar3->parent;
            if (pxVar3 == (xml_node_struct *)0x0) {
              return;
            }
          }
        } while( true );
      }
      pxVar3 = pxVar3->parent;
    } while (pxVar3 != (xml_node_struct *)0x0);
  }
  return;
}

Assistant:

void step_fill(xpath_node_set_raw& ns, const xpath_node& xn, xpath_allocator* alloc, bool once, T v)
		{
			const axis_t axis = T::axis;
			const bool axis_has_attributes = (axis == axis_ancestor || axis == axis_ancestor_or_self || axis == axis_descendant_or_self || axis == axis_following || axis == axis_parent || axis == axis_preceding || axis == axis_self);

			if (xn.node())
				step_fill(ns, xn.node().internal_object(), alloc, once, v);
			else if (axis_has_attributes && xn.attribute() && xn.parent())
				step_fill(ns, xn.attribute().internal_object(), xn.parent().internal_object(), alloc, once, v);
		}